

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateVariableDefinition(ExpressionTranslateContext *ctx,ExprVariableDefinition *expression)

{
  VariableData *variable;
  TypeBase *pTVar1;
  bool bVar2;
  ExprBase *pEVar3;
  char *format;
  
  variable = expression->variable->variable;
  Print(ctx,"/* Definition of variable \'%.*s\' */",
        (ulong)(uint)(*(int *)&(variable->name->name).end - (int)(variable->name->name).begin));
  pTVar1 = variable->type;
  pEVar3 = expression->initializer;
  if (pEVar3 == (ExprBase *)0x0) {
    format = "0";
    if (((variable->isVmAlloca != false) || (variable->lookupOnly != false)) ||
       (variable->scope->ownerNamespace != (NamespaceData *)0x0)) goto switchD_002360c8_caseD_1;
    if (pTVar1 == (TypeBase *)0x0) {
switchD_002360c8_caseD_c:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                    ,0x4aa,
                    "void TranslateVariableDefinition(ExpressionTranslateContext &, ExprVariableDefinition *)"
                   );
    }
    switch(pTVar1->typeID) {
    case 1:
      break;
    case 2:
      TranslateVariableName(ctx,variable);
      format = " = false";
      break;
    case 3:
    case 4:
    case 5:
    case 6:
    case 9:
    case 10:
    case 0xb:
    case 0x12:
      TranslateVariableName(ctx,variable);
      format = " = 0";
      break;
    case 7:
      TranslateVariableName(ctx,variable);
      format = " = 0.0f";
      break;
    case 8:
      TranslateVariableName(ctx,variable);
      format = " = 0.0";
      break;
    default:
      goto switchD_002360c8_caseD_c;
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x18:
    case 0x19:
      Print(ctx,"memset(&");
      TranslateVariableName(ctx,variable);
      Print(ctx,", 0, sizeof(");
      TranslateVariableName(ctx,variable);
      format = "))";
    }
    goto switchD_002360c8_caseD_1;
  }
  if (((variable->isVmAlloca == false) &&
      (pTVar1 != (TypeBase *)0x0 && variable->lookupOnly == false)) && (pTVar1->typeID == 0x18)) {
    Print(ctx,"(memset(&");
    TranslateVariableName(ctx,variable);
    Print(ctx,", 0, sizeof(");
    TranslateVariableName(ctx,variable);
    Print(ctx,")), ");
    pEVar3 = expression->initializer;
    bVar2 = true;
    if (pEVar3 != (ExprBase *)0x0) goto LAB_0023600b;
    Translate(ctx,(ExprBase *)0x0);
  }
  else {
    bVar2 = false;
LAB_0023600b:
    if (pEVar3->typeID == 0x36) {
      Print(ctx,"(");
      PrintLine(ctx);
      ctx->depth = ctx->depth + 1;
      for (pEVar3 = pEVar3 + 1; pEVar3 = (ExprBase *)pEVar3->_vptr_ExprBase,
          pEVar3 != (ExprBase *)0x0; pEVar3 = (ExprBase *)&pEVar3->next) {
        PrintIndent(ctx);
        Translate(ctx,pEVar3);
        if (pEVar3->next != (ExprBase *)0x0) {
          Print(ctx,",");
        }
        PrintLine(ctx);
      }
      ctx->depth = ctx->depth - 1;
      PrintIndent(ctx);
      format = ")";
      Print(ctx,")");
      if (!bVar2) {
        return;
      }
      goto switchD_002360c8_caseD_1;
    }
    Translate(ctx,pEVar3);
    if (!bVar2) {
      return;
    }
  }
  format = ")";
switchD_002360c8_caseD_1:
  Print(ctx,format);
  return;
}

Assistant:

void TranslateVariableDefinition(ExpressionTranslateContext &ctx, ExprVariableDefinition *expression)
{
	VariableData *variable = expression->variable->variable;

	Print(ctx, "/* Definition of variable '%.*s' */", FMT_ISTR(variable->name->name));

	TypeBase *type = variable->type;

	if(expression->initializer)
	{
		// Zero-initialize classes beforehand (if they are stored in a real local)
		bool zeroInitialize = !(variable->isVmAlloca || variable->lookupOnly) && isType<TypeClass>(type);

		if(zeroInitialize)
		{
			assert(!(variable->isVmAlloca || variable->lookupOnly));

			Print(ctx, "(memset(&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", 0, sizeof(");
			TranslateVariableName(ctx, variable);
			Print(ctx, ")), ");
		}

		if(ExprBlock *blockInitializer = getType<ExprBlock>(expression->initializer))
		{
			// Translate block initializer as a sequence
			Print(ctx, "(");
			PrintLine(ctx);

			ctx.depth++;

			for(ExprBase *curr = blockInitializer->expressions.head; curr; curr = curr->next)
			{
				PrintIndent(ctx);

				Translate(ctx, curr);

				if(curr->next)
					Print(ctx, ",");

				PrintLine(ctx);
			}

			ctx.depth--;

			PrintIndent(ctx);
			Print(ctx, ")");
		}
		else
		{
			Translate(ctx, expression->initializer);
		}

		if(zeroInitialize)
			Print(ctx, ")");
	}
	else if(variable->isVmAlloca || variable->lookupOnly || variable->scope->ownerNamespace)
	{
		Print(ctx, "0");
	}
	else
	{
		if(isType<TypeVoid>(type))
		{
			Print(ctx, "0");
		}
		else if(isType<TypeBool>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = false");
		}
		else if(isType<TypeChar>(type) || isType<TypeShort>(type) || isType<TypeInt>(type) || isType<TypeLong>(type) || isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeNullptr>(type) || isType<TypeRef>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0");
		}
		else if(isType<TypeFloat>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0.0f");
		}
		else if(isType<TypeDouble>(type))
		{
			TranslateVariableName(ctx, variable);
			Print(ctx, " = 0.0");
		}
		else if(isType<TypeAutoRef>(type) || isType<TypeAutoArray>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeClass>(type) || isType<TypeEnum>(type))
		{
			Print(ctx, "memset(&");
			TranslateVariableName(ctx, variable);
			Print(ctx, ", 0, sizeof(");
			TranslateVariableName(ctx, variable);
			Print(ctx, "))");
		}
		else
		{
			assert(!"unknown type");
		}
	}
}